

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-naming.h
# Opt level: O0

void wabt::RenameToIdentifiers<wabt::Func>
               (vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *things,BindingHash *bh,
               set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *filter)

{
  bool bVar1;
  reference ppFVar2;
  Func *thing;
  iterator __end0;
  iterator __begin0;
  vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *__range2;
  Index i;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *filter_local;
  BindingHash *bh_local;
  vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *things_local;
  
  __range2._4_4_ = 0;
  __end0 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::begin(things);
  thing = (Func *)std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::end(things);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<wabt::Func_**,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>
                                *)&thing);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<wabt::Func_**,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>
              ::operator*(&__end0);
    RenameToIdentifier(&(*ppFVar2)->name,__range2._4_4_,bh,filter);
    __gnu_cxx::
    __normal_iterator<wabt::Func_**,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>::
    operator++(&__end0);
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  return;
}

Assistant:

void RenameToIdentifiers(std::vector<T*>& things,
                         BindingHash& bh,
                         const std::set<std::string_view>* filter) {
  Index i = 0;
  for (auto thing : things) {
    RenameToIdentifier(thing->name, i++, bh, filter);
  }
}